

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOS.cpp
# Opt level: O0

void __thiscall adios2::core::ADIOS::ExitComputationBlock(ADIOS *this)

{
  bool bVar1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
  *in_RDI;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>
  *ioPair;
  iterator __end3;
  iterator __begin3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
  *__range3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_20;
  _Self local_18;
  IO *this_00;
  
  if (((ulong)in_RDI[0x7f]._M_node & 1) != 0) {
    *(undefined1 *)&in_RDI[0x7f]._M_node = 0;
    this_00 = (IO *)(in_RDI + 0x14);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
         ::begin(in_stack_ffffffffffffffc8);
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>_>
         ::end(in_stack_ffffffffffffffc8);
    while (bVar1 = std::operator!=(&local_18,&local_20), bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
                   *)0x8459d0);
      IO::ExitComputationBlock(this_00);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::IO>_>
      ::operator++(in_RDI);
    }
  }
  return;
}

Assistant:

void ADIOS::ExitComputationBlock() noexcept
{
    if (enteredComputationBlock)
    {
        enteredComputationBlock = false;
        for (auto &ioPair : m_IOs)
        {
            ioPair.second.ExitComputationBlock();
        }
    }
}